

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

int __thiscall
luna::Lexer::LexNumberXFractional
          (Lexer *this,TokenDetail *detail,bool integer_part,bool point,
          function<bool_(int)> *is_number_char,function<bool_(int)> *is_exponent)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  char (*args) [13];
  char *__nptr;
  byte in_CL;
  byte in_DL;
  double *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char (*in_R8) [2];
  double dVar4;
  double number;
  bool fractional_part;
  undefined8 in_stack_ffffffffffffff78;
  Lexer *in_stack_ffffffffffffff80;
  char (*in_stack_ffffffffffffffb8) [29];
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  byte bVar5;
  
  bVar5 = 0;
  while( true ) {
    iVar2 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    bVar1 = std::function<bool_(int)>::operator()
                      ((function<bool_(int)> *)in_stack_ffffffffffffff80,iVar2);
    if (!bVar1) break;
    std::__cxx11::string::push_back((char)in_RDI + '@');
    iVar2 = Next(in_stack_ffffffffffffff80);
    *(int *)(in_RDI + 0x30) = iVar2;
    bVar5 = 1;
  }
  if ((((in_CL & 1) != 0) && ((in_DL & 1) == 0)) && ((bVar5 & 1) == 0)) {
    uVar3 = __cxa_allocate_exception(0x20);
    args = (char (*) [13])String::GetCStr(*(String **)(in_RDI + 8));
    LexException::LexException<char_const(&)[13]>
              ((LexException *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               *in_stack_ffffffffffffffb8,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,args);
    __cxa_throw(uVar3,&LexException::typeinfo,LexException::~LexException);
  }
  if ((((in_CL & 1) == 0) && ((in_DL & 1) == 0)) && ((bVar5 & 1) == 0)) {
    uVar3 = __cxa_allocate_exception(0x20);
    String::GetCStr(*(String **)(in_RDI + 8));
    LexException::LexException<char_const(&)[29],std::__cxx11::string&,char_const(&)[2]>
              ((LexException *)CONCAT17(bVar5,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
               in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_RDI,
               in_R8);
    __cxa_throw(uVar3,&LexException::typeinfo,LexException::~LexException);
  }
  bVar1 = std::function<bool_(int)>::operator()
                    ((function<bool_(int)> *)in_stack_ffffffffffffff80,iVar2);
  if (bVar1) {
    std::__cxx11::string::push_back((char)in_RDI + '@');
    iVar2 = Next(in_stack_ffffffffffffff80);
    *(int *)(in_RDI + 0x30) = iVar2;
    if ((*(int *)(in_RDI + 0x30) == 0x2d) || (*(int *)(in_RDI + 0x30) == 0x2b)) {
      std::__cxx11::string::push_back((char)in_RDI + '@');
      iVar2 = Next(in_stack_ffffffffffffff80);
      *(int *)(in_RDI + 0x30) = iVar2;
    }
    iVar2 = isdigit(*(int *)(in_RDI + 0x30));
    if (iVar2 == 0) {
      uVar3 = __cxa_allocate_exception(0x20);
      String::GetCStr(*(String **)(in_RDI + 8));
      LexException::LexException<char_const(&)[24],std::__cxx11::string&,char_const(&)[2]>
                ((LexException *)CONCAT17(bVar5,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
                 ,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                 (char (*) [24])in_stack_ffffffffffffffb8,in_RDI,in_R8);
      __cxa_throw(uVar3,&LexException::typeinfo,LexException::~LexException);
    }
    while (iVar2 = isdigit(*(int *)(in_RDI + 0x30)), iVar2 != 0) {
      std::__cxx11::string::push_back((char)in_RDI + '@');
      iVar2 = Next(in_stack_ffffffffffffff80);
      *(int *)(in_RDI + 0x30) = iVar2;
    }
  }
  __nptr = (char *)std::__cxx11::string::c_str();
  dVar4 = strtod(__nptr,(char **)0x0);
  *in_RSI = dVar4;
  *(undefined4 *)(in_RSI + 3) = 0x117;
  *(undefined4 *)(in_RSI + 2) = *(undefined4 *)(in_RDI + 0x34);
  *(undefined4 *)((long)in_RSI + 0x14) = *(undefined4 *)(in_RDI + 0x38);
  in_RSI[1] = *(double *)(in_RDI + 8);
  return 0x117;
}

Assistant:

int Lexer::LexNumberXFractional(TokenDetail *detail,
                                    bool integer_part, bool point,
                                    const std::function<bool (int)> &is_number_char,
                                    const std::function<bool (int)> &is_exponent)
    {
        bool fractional_part = false;
        while (is_number_char(current_))
        {
            token_buffer_.push_back(current_);
            current_ = Next();
            fractional_part = true;
        }

        if (point && !integer_part && !fractional_part)
            throw LexException(module_->GetCStr(), line_, column_,
                    "unexpect '.'");
        else if (!point && !integer_part && !fractional_part)
            throw LexException(module_->GetCStr(), line_, column_,
                    "unexpect incomplete number '", token_buffer_, "'");

        if (is_exponent(current_))
        {
            token_buffer_.push_back(current_);
            current_ = Next();
            if (current_ == '-' || current_ == '+')
            {
                token_buffer_.push_back(current_);
                current_ = Next();
            }

            if (!isdigit(current_))
                throw LexException(module_->GetCStr(), line_, column_,
                        "expect exponent after '", token_buffer_, "'");

            while (isdigit(current_))
            {
                token_buffer_.push_back(current_);
                current_ = Next();
            }
        }

        double number = strtod(token_buffer_.c_str(), nullptr);
        RETURN_NUMBER_TOKEN_DETAIL(detail, number);
    }